

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

double feintrack::bhattacharrya_dist(hist_cont *source,hist_cont *dest)

{
  size_type sVar1;
  const_reference pvVar2;
  double dVar3;
  size_t stop_i;
  size_t i;
  double result;
  hist_cont *dest_local;
  hist_cont *source_local;
  
  i = 0;
  stop_i = 0;
  sVar1 = std::vector<double,_std::allocator<double>_>::size(source);
  for (; stop_i < sVar1; stop_i = stop_i + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](source,stop_i);
    dVar3 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](dest,stop_i);
    dVar3 = sqrt(dVar3 * *pvVar2);
    i = (size_t)(dVar3 + (double)i);
  }
  return (double)i;
}

Assistant:

double bhattacharrya_dist(const hist_cont& source, const hist_cont& dest)
	{
		double result = 0;
		for (size_t i = 0, stop_i = source.size(); i < stop_i; ++i)
		{
			result += std::sqrt(source[i] * dest[i]);
		}
		return result;
	}